

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfCsvParser.c
# Opt level: O2

sbfError sbfCsvParser_next(FILE *f,char ***fields,u_int *nfields,u_char separator,u_int *line)

{
  size_t sVar1;
  char cVar2;
  u_char uVar3;
  sbfError sVar4;
  int iVar5;
  char *pcVar6;
  int *piVar7;
  uint uVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  char *pcVar12;
  bool bVar13;
  size_t local_58;
  size_t len;
  uint local_44;
  char ***local_40;
  char *next;
  
  local_40 = fields;
  do {
    pcVar6 = fgetln(f,&len);
    if (pcVar6 == (char *)0x0) {
      piVar7 = __errno_location();
      sVar4 = *piVar7;
      iVar5 = feof((FILE *)f);
      if (iVar5 != 0) {
        return 2;
      }
      return sVar4;
    }
    if (line != (u_int *)0x0) {
      *line = *line + 1;
    }
    pcVar12 = pcVar6 + len;
    while (sVar9 = len - 1, sVar9 != 0xffffffffffffffff) {
      if ((*pcVar6 != ' ') && (*pcVar6 != '\t')) {
        if (pcVar6[sVar9] != '\n') goto LAB_00104ecd;
        bVar13 = sVar9 == 0;
        len = sVar9;
        goto LAB_00104ea8;
      }
      pcVar6 = pcVar6 + 1;
      len = sVar9;
    }
    bVar13 = true;
    pcVar6 = pcVar12;
LAB_00104ea8:
  } while (bVar13);
LAB_00104ecd:
  *local_40 = (char **)0x0;
  *nfields = 0;
  sVar9 = 0;
  uVar8 = (uint)separator;
LAB_00104ee6:
  next = (char *)0x0;
  local_58 = 0;
  while( true ) {
    if (len == sVar9) {
      pcVar6 = sbfMemory_strdup("");
      sbfCsvParserAdd(local_40,nfields,pcVar6);
      return 0;
    }
    cVar2 = pcVar6[sVar9];
    if ((cVar2 != ' ') && (cVar2 != '\t')) break;
    sVar9 = sVar9 + 1;
  }
  sVar10 = (cVar2 == '\"') + sVar9;
  local_44 = uVar8;
  while (bVar13 = true, sVar11 = local_58, sVar9 = len, sVar10 != len) {
    sVar1 = sVar10 + 1;
    uVar3 = pcVar6[sVar10];
    if ((cVar2 != '\"') && (uVar3 == separator)) goto LAB_00104f9b;
    if ((cVar2 == '\"') && (uVar3 == '\"')) {
      if (sVar1 == len) break;
      if (pcVar6[sVar1] != '\"') {
        sVar10 = sVar10 + 2;
        goto LAB_00104fc7;
      }
      sVar1 = sVar10 + 2;
    }
    sVar10 = sVar1;
    sbfCsvParserExpand(&next,&local_58,local_58);
    next[local_58 - 1] = uVar3;
  }
  goto LAB_00104ffb;
  while (sVar11 = local_58 - 1, next[local_58 - 1] == ' ') {
LAB_00104f9b:
    local_58 = sVar11;
    if (local_58 == 0) break;
  }
  bVar13 = false;
  sVar11 = local_58 - 1;
  sVar9 = sVar1;
LAB_00104ffb:
  sbfCsvParserExpand(&next,&local_58,sVar11);
  next[local_58 - 1] = '\0';
  sbfCsvParserAdd(local_40,nfields,next);
  uVar8 = local_44;
  if (bVar13) {
    return 0;
  }
  goto LAB_00104ee6;
LAB_00104fc7:
  if ((1 - len) + sVar10 == 2) goto LAB_00104ff4;
  cVar2 = pcVar6[sVar10 - 1];
  if ((cVar2 != ' ') && (cVar2 != '\t')) {
    sVar9 = sVar10;
    if ((int)cVar2 != local_44) {
      free(next);
      sbfCsvParser_free(*local_40,*nfields);
      return 0x16;
    }
    goto LAB_00104ff4;
  }
  sVar10 = sVar10 + 1;
  goto LAB_00104fc7;
LAB_00104ff4:
  bVar13 = sVar9 == len;
  sVar11 = 1 - len;
  goto LAB_00104ffb;
}

Assistant:

sbfError
sbfCsvParser_next (FILE* f,
                   char*** fields,
                   u_int* nfields,
                   u_char separator,
                   u_int* line)
{
    char*  buf;
    size_t len;
    size_t off;
    u_char c;
    char*  next;
    size_t nextlen;
    int    quoted;
    int    done;
    int    comma;
    int    saved_errno;

    do
    {
        buf = fgetln (f, &len);
        if (buf == NULL)
        {
            saved_errno = errno;
            if (feof (f))
                return ENOENT;
           return saved_errno;
        }
        if (line != NULL)
            (*line)++;
        while (len > 0 && (*buf == ' ' || *buf == '\t'))
        {
            buf++;
            len--;
        }
        if (len > 0 && buf[len - 1] == '\n')
            len--;
    }
    while (len == 0);

    *fields = NULL;
    *nfields = 0;

    off = 0;
    for (;;)
    {
        next = NULL;
        nextlen = 0;

        while (off != len && (buf[off] == ' ' || buf[off] == '\t'))
            off++;
        if (off == len)
        {
            sbfCsvParserAdd (fields, nfields, xstrdup (""));
            break;
        }

        quoted = buf[off] == '"';
        if (quoted)
            off++;

        comma = done = 0;
        while (off != len)
        {
            c = buf[off++];

            if (!quoted && c == separator)
            {
                while (nextlen > 0 && next[nextlen - 1] == ' ')
                    nextlen--;
                comma = 1;
                break;
            }
            if (quoted && c == '"')
            {
                if (off == len)
                    break;
                if (buf[off] != '"')
                {
                    while (off != len && (buf[off] == ' ' || buf[off] == '\t'))
                        off++;
                    if (off != len && buf[off++] != separator)
                        goto fail;
                    if (off != len)
                        comma = 1;
                    break;
                }
                else
                    off++;
            }

            sbfCsvParserExpand (&next, &nextlen, 1);
            next[nextlen - 1] = c;
        }

        sbfCsvParserExpand (&next, &nextlen, 1);
        next[nextlen - 1] = '\0';
        sbfCsvParserAdd (fields, nfields, next);

        if (!comma)
            break;
    }

    return 0;

fail:
    if (next != NULL)
        free (next);
    sbfCsvParser_free (*fields, *nfields);
    return EINVAL;
}